

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryNodeAnim(AssbinExport *this,IOStream *container,aiNodeAnim *nd)

{
  uint uVar1;
  aiVectorKey *paVar2;
  aiQuatKey *in;
  AssbinChunkWriter chunk;
  aiAnimBehaviour local_64;
  AssbinChunkWriter local_60;
  
  local_60.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_00758758;
  local_60.buffer = (uint8_t *)0x0;
  local_60.magic = 0x1238;
  local_60.cur_size = 0;
  local_60.cursor = 0;
  local_60.initial = 0x1000;
  local_60.container = container;
  Write<aiString>(&local_60.super_IOStream,&nd->mNodeName);
  Write<unsigned_int>(&local_60.super_IOStream,&nd->mNumPositionKeys);
  Write<unsigned_int>(&local_60.super_IOStream,&nd->mNumRotationKeys);
  Write<unsigned_int>(&local_60.super_IOStream,&nd->mNumScalingKeys);
  local_64 = nd->mPreState;
  Write<unsigned_int>(&local_60.super_IOStream,&local_64);
  local_64 = nd->mPostState;
  Write<unsigned_int>(&local_60.super_IOStream,&local_64);
  paVar2 = nd->mPositionKeys;
  if (paVar2 != (aiVectorKey *)0x0) {
    uVar1 = nd->mNumPositionKeys;
    if (this->shortened == true) {
      WriteBounds<aiVectorKey>(&local_60.super_IOStream,paVar2,uVar1);
    }
    else {
      WriteArray<aiVectorKey>(&local_60.super_IOStream,paVar2,uVar1);
    }
  }
  in = nd->mRotationKeys;
  if (in != (aiQuatKey *)0x0) {
    uVar1 = nd->mNumRotationKeys;
    if (this->shortened == true) {
      WriteBounds<aiQuatKey>(&local_60.super_IOStream,in,uVar1);
    }
    else {
      WriteArray<aiQuatKey>(&local_60.super_IOStream,in,uVar1);
    }
  }
  paVar2 = nd->mScalingKeys;
  if (paVar2 != (aiVectorKey *)0x0) {
    uVar1 = nd->mNumScalingKeys;
    if (this->shortened == true) {
      WriteBounds<aiVectorKey>(&local_60.super_IOStream,paVar2,uVar1);
    }
    else {
      WriteArray<aiVectorKey>(&local_60.super_IOStream,paVar2,uVar1);
    }
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_60);
  return;
}

Assistant:

void WriteBinaryNodeAnim(IOStream * container, const aiNodeAnim* nd)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AINODEANIM );

        Write<aiString>(&chunk,nd->mNodeName);
        Write<unsigned int>(&chunk,nd->mNumPositionKeys);
        Write<unsigned int>(&chunk,nd->mNumRotationKeys);
        Write<unsigned int>(&chunk,nd->mNumScalingKeys);
        Write<unsigned int>(&chunk,nd->mPreState);
        Write<unsigned int>(&chunk,nd->mPostState);

        if (nd->mPositionKeys) {
            if (shortened) {
                WriteBounds(&chunk,nd->mPositionKeys,nd->mNumPositionKeys);

            } // else write as usual
            else WriteArray<aiVectorKey>(&chunk,nd->mPositionKeys,nd->mNumPositionKeys);
        }
        if (nd->mRotationKeys) {
            if (shortened) {
                WriteBounds(&chunk,nd->mRotationKeys,nd->mNumRotationKeys);

            } // else write as usual
            else WriteArray<aiQuatKey>(&chunk,nd->mRotationKeys,nd->mNumRotationKeys);
        }
        if (nd->mScalingKeys) {
            if (shortened) {
                WriteBounds(&chunk,nd->mScalingKeys,nd->mNumScalingKeys);

            } // else write as usual
            else WriteArray<aiVectorKey>(&chunk,nd->mScalingKeys,nd->mNumScalingKeys);
        }
    }